

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_attach.cpp
# Opt level: O1

unique_ptr<duckdb::AttachStatement,_std::default_delete<duckdb::AttachStatement>,_true> __thiscall
duckdb::Transformer::TransformAttach(Transformer *this,PGAttachStmt *stmt)

{
  char *pcVar1;
  char *pcVar2;
  _Head_base<0UL,_duckdb::AttachInfo_*,_false> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var4;
  _Head_base<0UL,_duckdb::AttachInfo_*,_false> _Var5;
  _Head_base<0UL,_duckdb::AttachStatement_*,_false> _Var6;
  OnCreateConflict OVar7;
  Transformer *pTVar8;
  size_t sVar9;
  pointer pAVar10;
  pointer pCVar11;
  mapped_type *this_00;
  pointer pAVar12;
  long in_RDX;
  pointer *__ptr;
  long *plVar13;
  PGValue val_00;
  templated_unique_single_t info;
  optional_ptr<duckdb_libpgquery::PGDefElem,_true> def_elem;
  Value val;
  _Head_base<0UL,_duckdb::AttachInfo_*,_false> local_110;
  allocator local_101;
  optional_ptr<duckdb_libpgquery::PGDefElem,_true> local_100;
  _Head_base<0UL,_duckdb::AttachStatement_*,_false> local_f8;
  PGAttachStmt *local_f0;
  string local_e8;
  undefined1 local_c8 [64];
  Value local_88;
  LogicalType local_48;
  
  local_f0 = stmt;
  pTVar8 = (Transformer *)operator_new(0x80);
  AttachStatement::AttachStatement((AttachStatement *)pTVar8);
  (this->parent).ptr = pTVar8;
  local_110._M_head_impl = (AttachInfo *)operator_new(0x90);
  ((local_110._M_head_impl)->super_ParseInfo).info_type = ATTACH_INFO;
  ((local_110._M_head_impl)->super_ParseInfo)._vptr_ParseInfo =
       (_func_int **)&PTR__AttachInfo_024abf68;
  ((local_110._M_head_impl)->name)._M_dataplus._M_p =
       (pointer)&((local_110._M_head_impl)->name).field_2;
  ((local_110._M_head_impl)->name)._M_string_length = 0;
  ((local_110._M_head_impl)->name).field_2._M_local_buf[0] = '\0';
  ((local_110._M_head_impl)->path)._M_dataplus._M_p =
       (pointer)&((local_110._M_head_impl)->path).field_2;
  ((local_110._M_head_impl)->path)._M_string_length = 0;
  ((local_110._M_head_impl)->path).field_2._M_local_buf[0] = '\0';
  ((local_110._M_head_impl)->options)._M_h._M_buckets =
       &((local_110._M_head_impl)->options)._M_h._M_single_bucket;
  ((local_110._M_head_impl)->options)._M_h._M_bucket_count = 1;
  ((local_110._M_head_impl)->options)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ((local_110._M_head_impl)->options)._M_h._M_element_count = 0;
  ((local_110._M_head_impl)->options)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ((local_110._M_head_impl)->options)._M_h._M_rehash_policy._M_next_resize = 0;
  ((local_110._M_head_impl)->options)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (local_110._M_head_impl)->on_conflict = ERROR_ON_CONFLICT;
  pcVar1 = *(char **)(in_RDX + 0x10);
  pp_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
            &local_88.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_88.type_._0_8_ = pp_Var4;
  if (pcVar1 == (char *)0x0) {
    local_88.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_88.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
         AUTO_INCREMENT;
  }
  else {
    sVar9 = strlen(pcVar1);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar1,pcVar1 + sVar9);
  }
  pAVar10 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::
            operator->((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                        *)&local_110);
  ::std::__cxx11::string::operator=((string *)&pAVar10->name,(string *)&local_88);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_88.type_._0_8_ != pp_Var4) {
    operator_delete((void *)local_88.type_._0_8_);
  }
  pcVar1 = *(char **)(in_RDX + 8);
  pAVar10 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::
            operator->((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                        *)&local_110);
  pTVar8 = (Transformer *)&pAVar10->path;
  pcVar2 = (char *)(pAVar10->path)._M_string_length;
  strlen(pcVar1);
  ::std::__cxx11::string::_M_replace((ulong)pTVar8,0,pcVar2,(ulong)pcVar1);
  OVar7 = TransformOnConflict(pTVar8,*(PGOnCreateConflict *)(in_RDX + 0x28));
  pAVar10 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::
            operator->((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                        *)&local_110);
  pAVar10->on_conflict = OVar7;
  local_f8._M_head_impl = (AttachStatement *)this;
  if ((*(long *)(in_RDX + 0x18) != 0) &&
     (plVar13 = *(long **)(*(long *)(in_RDX + 0x18) + 8), plVar13 != (long *)0x0)) {
    do {
      local_100.ptr = (PGDefElem *)*plVar13;
      LogicalType::LogicalType(&local_48,SQLNULL);
      Value::Value(&local_88,&local_48);
      LogicalType::~LogicalType(&local_48);
      optional_ptr<duckdb_libpgquery::PGDefElem,_true>::CheckValid(&local_100);
      if ((local_100.ptr)->arg == (PGNode *)0x0) {
        Value::BOOLEAN((Value *)local_c8,true);
        Value::operator=(&local_88,(Value *)local_c8);
        Value::~Value((Value *)local_c8);
      }
      else {
        optional_ptr<duckdb_libpgquery::PGDefElem,_true>::CheckValid(&local_100);
        local_e8._M_dataplus._M_p = (pointer)(local_100.ptr)->arg;
        optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_e8);
        val_00.val.ival._0_4_ = *(undefined4 *)local_e8._M_dataplus._M_p;
        val_00._0_8_ = local_f0;
        val_00.val.ival._4_4_ = 0;
        TransformValue((Transformer *)local_c8,val_00);
        pCVar11 = unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                  ::operator->((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                                *)local_c8);
        Value::operator=(&local_88,&pCVar11->value);
        if ((Transformer *)local_c8._0_8_ != (Transformer *)0x0) {
          (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_c8._0_8_)->ptr->options)();
        }
      }
      pAVar10 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::
                operator->((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                            *)&local_110);
      optional_ptr<duckdb_libpgquery::PGDefElem,_true>::CheckValid(&local_100);
      ::std::__cxx11::string::string((string *)&local_e8,(local_100.ptr)->defname,&local_101);
      StringUtil::Lower((string *)local_c8,&local_e8);
      this_00 = ::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pAVar10->options,(key_type *)local_c8);
      Value::operator=(this_00,&local_88);
      if ((Transformer *)local_c8._0_8_ != (Transformer *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      Value::~Value(&local_88);
      plVar13 = (long *)plVar13[1];
    } while (plVar13 != (long *)0x0);
  }
  _Var6._M_head_impl = local_f8._M_head_impl;
  pAVar12 = unique_ptr<duckdb::AttachStatement,_std::default_delete<duckdb::AttachStatement>,_true>
            ::operator->((unique_ptr<duckdb::AttachStatement,_std::default_delete<duckdb::AttachStatement>,_true>
                          *)local_f8._M_head_impl);
  _Var5._M_head_impl = local_110._M_head_impl;
  local_110._M_head_impl = (AttachInfo *)0x0;
  _Var3._M_head_impl =
       (pAVar12->info).
       super_unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_>._M_t.
       super___uniq_ptr_impl<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::AttachInfo_*,_std::default_delete<duckdb::AttachInfo>_>.
       super__Head_base<0UL,_duckdb::AttachInfo_*,_false>._M_head_impl;
  (pAVar12->info).super_unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_>.
  _M_t.super___uniq_ptr_impl<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::AttachInfo_*,_std::default_delete<duckdb::AttachInfo>_>.
  super__Head_base<0UL,_duckdb::AttachInfo_*,_false>._M_head_impl = _Var5._M_head_impl;
  if (_Var3._M_head_impl != (AttachInfo *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_ParseInfo + 8))();
  }
  if (local_110._M_head_impl != (AttachInfo *)0x0) {
    (*((local_110._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  return (unique_ptr<duckdb::AttachStatement,_std::default_delete<duckdb::AttachStatement>_>)
         (unique_ptr<duckdb::AttachStatement,_std::default_delete<duckdb::AttachStatement>_>)
         _Var6._M_head_impl;
}

Assistant:

unique_ptr<AttachStatement> Transformer::TransformAttach(duckdb_libpgquery::PGAttachStmt &stmt) {
	auto result = make_uniq<AttachStatement>();
	auto info = make_uniq<AttachInfo>();
	info->name = stmt.name ? stmt.name : string();
	info->path = stmt.path;
	info->on_conflict = TransformOnConflict(stmt.onconflict);

	if (stmt.options) {
		duckdb_libpgquery::PGListCell *cell;
		for_each_cell(cell, stmt.options->head) {
			auto def_elem = PGPointerCast<duckdb_libpgquery::PGDefElem>(cell->data.ptr_value);
			Value val;
			if (def_elem->arg) {
				val = TransformValue(*PGPointerCast<duckdb_libpgquery::PGValue>(def_elem->arg))->value;
			} else {
				val = Value::BOOLEAN(true);
			}
			info->options[StringUtil::Lower(def_elem->defname)] = std::move(val);
		}
	}
	result->info = std::move(info);
	return result;
}